

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void slang::ast::UninstantiatedDefSymbol::fromSyntax
               (Compilation *compilation,HierarchyInstantiationSyntax *syntax,
               ASTContext *parentContext,SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  size_t sVar1;
  NetType *netType;
  HierarchicalInstanceSyntax *instanceSyntax;
  ASTContext *context_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar2;
  string_view moduleName;
  iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*> local_168;
  Compilation *local_158;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_150;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_148;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_140;
  ASTContext context;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  implicitNetNames;
  
  local_158 = compilation;
  local_150 = results;
  local_148 = implicitNets;
  ASTContext::resetFlags(&context,parentContext,(bitmask<slang::ast::ASTFlags>)0x20);
  sVar2 = createUninstantiatedParams
                    ((ast *)syntax,(HierarchyInstantiationSyntax *)&context,context_00);
  moduleName = parsing::Token::valueText(&syntax->type);
  local_140 = sVar2;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::SmallSet(&implicitNetNames);
  netType = Scope::getDefaultNetType(context.scope.ptr);
  local_168.index = 0;
  sVar1 = (syntax->instances).elements._M_extent._M_extent_value;
  local_168.list = &syntax->instances;
  for (; (local_168.list != &syntax->instances || (local_168.index != sVar1 + 1 >> 1));
      local_168.index = local_168.index + 1) {
    instanceSyntax =
         slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
         iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>::dereference(&local_168);
    createUninstantiatedDef<slang::syntax::HierarchyInstantiationSyntax>
              (local_158,syntax,instanceSyntax,moduleName,&context,local_140,local_150,local_148,
               &implicitNetNames,netType);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                 *)&implicitNetNames.super_Storage.field_0x88);
  return;
}

Assistant:

void UninstantiatedDefSymbol::fromSyntax(Compilation& compilation,
                                         const HierarchyInstantiationSyntax& syntax,
                                         const ASTContext& parentContext,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto params = createUninstantiatedParams(syntax, context);

    createUninstantiatedDefs(compilation, syntax, syntax.type.valueText(), context, params, results,
                             implicitNets);
}